

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3EndTransaction(Parse *pParse,int eType)

{
  int iVar1;
  Vdbe *p;
  char *zArg1;
  
  zArg1 = "COMMIT";
  if (eType == 0xc) {
    zArg1 = "ROLLBACK";
  }
  iVar1 = sqlite3AuthCheck(pParse,0x16,zArg1,(char *)0x0,(char *)0x0);
  if (iVar1 == 0) {
    p = sqlite3GetVdbe(pParse);
    if (p != (Vdbe *)0x0) {
      sqlite3VdbeAddOp3(p,1,1,(uint)(eType == 0xc),0);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3EndTransaction(Parse *pParse, int eType){
  Vdbe *v;
  int isRollback;

  assert( pParse!=0 );
  assert( pParse->db!=0 );
  assert( eType==TK_COMMIT || eType==TK_END || eType==TK_ROLLBACK );
  isRollback = eType==TK_ROLLBACK;
  if( sqlite3AuthCheck(pParse, SQLITE_TRANSACTION, 
       isRollback ? "ROLLBACK" : "COMMIT", 0, 0) ){
    return;
  }
  v = sqlite3GetVdbe(pParse);
  if( v ){
    sqlite3VdbeAddOp2(v, OP_AutoCommit, 1, isRollback);
  }
}